

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

void __thiscall tcu::FileResource::~FileResource(FileResource *this)

{
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__FileResource_00c47ae8;
  fclose((FILE *)this->m_file);
  Resource::~Resource(&this->super_Resource);
  return;
}

Assistant:

FileResource::~FileResource ()
{
	fclose(m_file);
}